

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O1

int listener_set(nng_listener lid,char *name,void *v,size_t sz,nni_type t)

{
  int iVar1;
  nni_listener *in_RAX;
  nni_listener *local_38;
  nni_listener *l;
  
  local_38 = in_RAX;
  iVar1 = nni_listener_find(&local_38,lid.id);
  if (iVar1 == 0) {
    iVar1 = nni_listener_setopt(local_38,name,v,sz,t);
    nni_listener_rele(local_38);
  }
  return iVar1;
}

Assistant:

static int
listener_set(
    nng_listener lid, const char *name, const void *v, size_t sz, nni_type t)
{
	nni_listener *l;
	int           rv;

	if ((rv = nni_listener_find(&l, lid.id)) != 0) {
		return (rv);
	}
	rv = nni_listener_setopt(l, name, v, sz, t);
	nni_listener_rele(l);
	return (rv);
}